

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_methods<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
                *matrix)

{
  undefined4 local_190;
  int local_18c;
  undefined4 *local_188;
  int *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined8 *local_168;
  undefined4 **local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined8 *local_148;
  int **local_140;
  undefined1 local_138 [8];
  undefined8 local_130;
  shared_count sStack_128;
  char *local_120;
  char *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x372);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_180 = &local_18c;
  local_188 = &local_190;
  local_190 = 3;
  local_138[0] = local_18c == 3;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_140 = &local_180;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 0;
  local_160 = &local_188;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x373);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_138[0] = local_18c == 4;
  local_190 = 4;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_180 = &local_18c;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_180;
  local_188 = &local_190;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_110,&local_120,0x373,1,2,2,"matrix[1].get_dimension()",&local_158,"4",
             &local_178);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x374);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_138[0] = local_18c == 4;
  local_190 = 4;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_180 = &local_18c;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_180;
  local_188 = &local_190;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_110,&local_120,0x374,1,2,2,"matrix[2].get_dimension()",&local_158,"4",
             &local_178);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x375);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_138[0] = local_18c == 0;
  local_190 = 0;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_180 = &local_18c;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_180;
  local_188 = &local_190;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_110,&local_120,0x375,1,2,2,"matrix[3].get_dimension()",&local_158,"0",
             &local_178);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x376);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_138[0] = local_18c == 3;
  local_190 = 3;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_180 = &local_18c;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_180;
  local_188 = &local_190;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_110,&local_120,0x376,1,2,2,"matrix[4].get_dimension()",&local_158,"3",
             &local_178);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x377);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00228440;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_18c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_138[0] = local_18c == 4;
  local_190 = 4;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_180 = &local_18c;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_002286c0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_180;
  local_188 = &local_190;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_002286c0;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_138,&local_110,&local_120,0x377,1,2,2,"matrix[5].get_dimension()",&local_158,"4",
             &local_178);
  boost::detail::shared_count::~shared_count(&sStack_128);
  return;
}

Assistant:

void column_test_boundary_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 3);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 0);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 3);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}